

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderMouseCursor
               (ImVec2 base_pos,float base_scale,ImGuiMouseCursor mouse_cursor,ImU32 col_fill,
               ImU32 col_border,ImU32 col_shadow)

{
  ImFontAtlas *this;
  ImTextureID texture_id;
  ImU32 col;
  bool bVar1;
  ImDrawList *this_00;
  long lVar2;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  ImVec2 pos;
  ImVec2 uv [4];
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImU32 local_b8;
  ImU32 local_b4;
  ImU32 local_b0;
  ImGuiMouseCursor local_ac;
  ImGuiContext *local_a8;
  ImVec2 local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [24];
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = base_pos;
  local_48._12_4_ = in_XMM0_Dd;
  local_a8 = GImGui;
  if (0 < (GImGui->Viewports).Size) {
    local_58 = base_scale * 2.0;
    fStack_64 = base_scale * 0.0;
    fStack_60 = base_scale * 0.0;
    fStack_5c = base_scale * 0.0;
    lVar2 = 0;
    local_b8 = col_fill;
    local_b4 = col_border;
    local_b0 = col_shadow;
    local_ac = mouse_cursor;
    local_98 = base_scale;
    fStack_94 = base_scale;
    fStack_90 = base_scale;
    fStack_8c = base_scale;
    local_68 = base_scale;
    fStack_54 = fStack_64;
    fStack_50 = fStack_60;
    fStack_4c = fStack_5c;
    do {
      this_00 = GetViewportDrawList((local_a8->Viewports).Data[lVar2],1,"##Foreground");
      this = this_00->_Data->Font->ContainerAtlas;
      local_a0.x = 0.0;
      local_a0.y = 0.0;
      local_d0.x = 0.0;
      local_d0.y = 0.0;
      local_78.x = 0.0;
      local_78.y = 0.0;
      IStack_70.x = 0.0;
      IStack_70.y = 0.0;
      local_88.x = 0.0;
      local_88.y = 0.0;
      IStack_80.x = 0.0;
      IStack_80.y = 0.0;
      bVar1 = ImFontAtlas::GetMouseCursorTexData
                        (this,local_ac,&local_a0,&local_d0,&local_88,&local_78);
      if (bVar1) {
        local_d8.x = (float)local_48._0_4_ - local_a0.x;
        local_d8.y = (float)local_48._4_4_ - local_a0.y;
        texture_id = this->TexID;
        ImDrawList::PushTextureID(this_00,texture_id);
        col = local_b0;
        local_c8.x = local_68 + local_d8.x;
        local_c8.y = fStack_64 + local_d8.y;
        local_c0.x = (local_d0.x + 1.0) * local_98 + local_d8.x;
        local_c0.y = (local_d0.y + 0.0) * fStack_94 + local_d8.y;
        ImDrawList::AddImage(this_00,texture_id,&local_c8,&local_c0,&local_78,&IStack_70,local_b0);
        local_c8.x = local_58 + local_d8.x;
        local_c8.y = fStack_54 + local_d8.y;
        local_c0.x = (local_d0.x + 2.0) * local_98 + local_d8.x;
        local_c0.y = (local_d0.y + 0.0) * fStack_94 + local_d8.y;
        ImDrawList::AddImage(this_00,texture_id,&local_c8,&local_c0,&local_78,&IStack_70,col);
        local_c8.x = local_d8.x + local_d0.x * local_98;
        local_c8.y = local_d8.y + local_d0.y * fStack_94;
        ImDrawList::AddImage(this_00,texture_id,&local_d8,&local_c8,&local_78,&IStack_70,local_b4);
        local_c8.x = local_d8.x + local_d0.x * local_98;
        local_c8.y = local_d8.y + local_d0.y * fStack_94;
        ImDrawList::AddImage(this_00,texture_id,&local_d8,&local_c8,&local_88,&IStack_80,local_b8);
        ImDrawList::PopTextureID(this_00);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (local_a8->Viewports).Size);
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImVec2 base_pos, float base_scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        ImDrawList* draw_list = GetForegroundDrawList(viewport);
        ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
        ImVec2 offset, size, uv[4];
        if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
        {
            const ImVec2 pos = base_pos - offset;
            const float scale = base_scale;
            ImTextureID tex_id = font_atlas->TexID;
            draw_list->PushTextureID(tex_id);
            draw_list->AddImage(tex_id, pos + ImVec2(1, 0) * scale, pos + (ImVec2(1, 0) + size) * scale, uv[2], uv[3], col_shadow);
            draw_list->AddImage(tex_id, pos + ImVec2(2, 0) * scale, pos + (ImVec2(2, 0) + size) * scale, uv[2], uv[3], col_shadow);
            draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[2], uv[3], col_border);
            draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[0], uv[1], col_fill);
            draw_list->PopTextureID();
        }
    }
}